

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

void GD::print_lda_features(vw *all,example *ec)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  ostream *poVar4;
  weight *pwVar5;
  byte *pbVar6;
  float *pfVar7;
  byte *pbVar8;
  size_t *psVar9;
  size_t k;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar10;
  ulong uVar11;
  
  pbVar2 = (ec->super_example_predict).indices._end;
  pbVar8 = (ec->super_example_predict).indices._begin;
  for (pbVar6 = pbVar8; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1) {
  }
  for (; pbVar8 != pbVar2; pbVar8 = pbVar8 + 1) {
    bVar1 = *pbVar8;
    pfVar3 = (ec->super_example_predict).feature_space[bVar1].values._end;
    psVar9 = (ec->super_example_predict).feature_space[bVar1].indicies._begin;
    psVar10 = (ec->super_example_predict).feature_space[bVar1].space_names._begin;
    for (pfVar7 = (ec->super_example_predict).feature_space[bVar1].values._begin; pfVar7 != pfVar3;
        pfVar7 = pfVar7 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout,'\t');
      poVar4 = std::operator<<(poVar4,(string *)
                                      (psVar10->
                                      super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr);
      poVar4 = std::operator<<(poVar4,'^');
      poVar4 = std::operator<<(poVar4,(string *)
                                      &((psVar10->
                                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->second);
      poVar4 = std::operator<<(poVar4,':');
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,':');
      std::ostream::operator<<(poVar4,*pfVar7);
      for (uVar11 = 0; uVar11 < all->lda; uVar11 = uVar11 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,':');
        pwVar5 = parameters::operator[](&all->weights,*psVar9);
        std::ostream::operator<<(poVar4,pwVar5[uVar11]);
      }
      psVar9 = psVar9 + 1;
      psVar10 = psVar10 + 1;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout," total of ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  poVar4 = std::operator<<(poVar4," features.");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void print_lda_features(vw& all, example& ec)
{
  parameters& weights = all.weights;
  uint32_t stride_shift = weights.stride_shift();
  size_t count = 0;
  for (features& fs : ec) count += fs.size();
  for (features& fs : ec)
  {
    for (features::iterator_all& f : fs.values_indices_audit())
    {
      cout << '\t' << f.audit().get()->first << '^' << f.audit().get()->second << ':'
           << ((f.index() >> stride_shift) & all.parse_mask) << ':' << f.value();
      for (size_t k = 0; k < all.lda; k++) cout << ':' << (&weights[f.index()])[k];
    }
  }
  cout << " total of " << count << " features." << endl;
}